

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_InStateSequence
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  long *plVar2;
  PClass *pPVar3;
  int iVar4;
  PClass *pPVar5;
  undefined4 uVar6;
  long *plVar7;
  long *plVar8;
  char *pcVar9;
  bool bVar10;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (puVar1 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar1[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar1)(puVar1);
            puVar1[1] = pPVar5;
          }
          bVar10 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar3 && bVar10) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar10 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar3) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar10) {
            pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0042c1e6;
          }
        }
LAB_0042c14b:
        if (numparam == 1) {
          pcVar9 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\x03') {
            if (numparam < 3) {
              pcVar9 = "(paramnum) < numparam";
            }
            else {
              if (param[2].field_0.field_3.Type == '\x03') {
                plVar7 = (long *)param[2].field_0.field_1.a;
                iVar4 = 0;
                uVar6 = 0;
                if (plVar7 != (long *)0x0) {
                  do {
                    if (plVar7 == (long *)param[1].field_0.field_1.a) {
                      uVar6 = 1;
                      goto LAB_0042c1a6;
                    }
                    plVar2 = (long *)*plVar7;
                    plVar8 = plVar7 + 5;
                    plVar7 = plVar2;
                  } while (plVar2 == plVar8);
                  uVar6 = 0;
                }
LAB_0042c1a6:
                if (0 < numret) {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                  ,0x248,
                                  "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  if (ret->RegType != '\0') {
                    __assert_fail("RegType == REGT_INT",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                  ,0x13f,"void VMReturn::SetInt(int)");
                  }
                  *(undefined4 *)ret->Location = uVar6;
                  iVar4 = 1;
                }
                return iVar4;
              }
              pcVar9 = "param[paramnum].Type == REGT_POINTER";
            }
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x247,
                          "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar9 = "param[paramnum].Type == REGT_POINTER";
        }
        __assert_fail(pcVar9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x246,
                      "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (puVar1 == (undefined8 *)0x0) goto LAB_0042c14b;
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042c1e6:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x245,
                "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, InStateSequence)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER(newstate, FState);
	PARAM_POINTER(basestate, FState);
	ACTION_RETURN_BOOL(self->InStateSequence(newstate, basestate));
}